

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O2

void Ptex::v2_2::(anonymous_namespace)::ApplyS<unsigned_char,4>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int nTxChan)

{
  int iVar1;
  int iVar2;
  uchar *val;
  uchar *puVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  VecAccum<unsigned_char,_4> local_4d;
  int local_4c;
  int local_48;
  float local_44;
  float local_40;
  float local_3c;
  void *local_38;
  
  fVar5 = k->A + k->A;
  local_4c = nTxChan;
  local_44 = fVar5;
  local_38 = data;
  for (local_48 = k->v1; local_48 != k->v2; local_48 = local_48 + 1) {
    iVar1 = k->rowlen - local_48;
    iVar2 = iVar1 - k->w2;
    if (iVar2 < k->u1) {
      iVar2 = k->u1;
    }
    iVar1 = iVar1 - k->w1;
    if (k->u2 < iVar1) {
      iVar1 = k->u2;
    }
    fVar6 = (float)iVar2 - k->u;
    fVar4 = (float)local_48 - k->v;
    local_40 = (fVar6 + fVar6 + 1.0) * k->A + fVar4 * k->B;
    local_3c = k->A * fVar6 * fVar6 + (k->B * fVar6 + k->C * fVar4) * fVar4;
    val = (uchar *)((long)((k->rowlen * local_48 + iVar2) * local_4c) + (long)local_38);
    puVar3 = val + (iVar1 - iVar2) * local_4c;
    for (; val < puVar3; val = val + nTxChan) {
      if (local_3c < 1.0) {
        fVar5 = anon_unknown_2::gaussian(local_3c);
        fVar5 = fVar5 * k->wscale;
        k->weight = k->weight + fVar5;
        PtexUtils::VecAccum<unsigned_char,_4>::operator()(&local_4d,result,val,fVar5);
        fVar5 = local_44;
      }
      local_3c = local_3c + local_40;
      local_40 = local_40 + fVar5;
    }
  }
  return;
}

Assistant:

void ApplyS(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int nTxChan)
    {
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }